

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

void __thiscall dxil_spv::Converter::Impl::push_ags_instruction(Impl *this,CallInst *instruction)

{
  AgsInstruction *pAVar1;
  uint uVar2;
  bool bVar3;
  uint in_EAX;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t op;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  bVar3 = get_constant_operand(&instruction->super_Instruction,2,(uint32_t *)((long)&uStack_18 + 4))
  ;
  if (bVar3) {
    if ((uStack_18._4_4_ & 0xf0000000) == 0x50000000) {
      uVar5 = (ulong)uStack_18._4_4_ & 0xff;
      uVar4 = uStack_18._4_4_ >> 0x18 & 3;
      if (((byte)(uStack_18 >> 0x20) < 0x34) &&
         ((0xfe70000000000U >> ((ulong)uStack_18._4_4_ & 0x3f) & 1) != 0)) {
        (this->shader_analysis).require_subgroups = true;
        (this->shader_analysis).require_wmma = true;
      }
      uVar7 = (this->ags).current_phase;
      if ((uVar4 < uVar7) ||
         ((uVar2 = (this->ags).num_instructions, uVar6 = (ulong)uVar2, uVar2 != 0 &&
          ((this->ags).instructions[0].opcode != (uint32_t)uVar5)))) {
        uVar6 = 0;
        (this->ags).current_phase = 0;
        (this->ags).num_instructions = 0;
        (this->ags).active_read_backdoor = (Value *)0x0;
        uVar7 = 0;
      }
      if ((uVar7 == uVar4 || uVar7 + 1 == uVar4) && ((uint)uVar6 < 0x15 && uVar4 <= (uint)uVar6)) {
        uVar5 = (ulong)uVar4 << 0x20 | uVar5;
        pAVar1 = (this->ags).instructions + uVar6;
        pAVar1->opcode = (int)uVar5;
        pAVar1->phase = (int)(uVar5 >> 0x20);
        (this->ags).instructions[uVar6].immediate = uStack_18._4_4_ >> 8 & 0xffff;
        uVar7 = (this->ags).num_instructions;
        (this->ags).backdoor_instructions[uVar7] = instruction;
        (this->ags).num_instructions = uVar7 + 1;
        (this->ags).current_phase = uVar4;
      }
    }
  }
  return;
}

Assistant:

void Converter::Impl::push_ags_instruction(const llvm::CallInst *instruction)
{
	uint32_t op = 0;
	if (!get_constant_operand(instruction, 2, &op))
		return;

	if (!is_ags_magic(op))
		return;

	auto inst = decode_ags_instruction(op);

	switch (inst.opcode)
	{
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavStore:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixCopy:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsStore:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixMulAcc:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixFill:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementFill:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLength:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementExtract:
		shader_analysis.require_subgroups = true;
		shader_analysis.require_wmma = true;
		break;
	}

	// Reset if we're beginning a new instruction sequence.
	// New instruction type, reset.
	if (inst.phase < ags.current_phase ||
	    (ags.num_instructions && inst.opcode != ags.instructions[0].opcode))
	{
		ags.reset();
	}

	if ((inst.phase == ags.current_phase || (inst.phase == ags.current_phase + 1)) &&
	    inst.phase <= ags.num_instructions &&
	    ags.num_instructions < AgsInstruction::MaxInstructions)
	{
		ags.instructions[ags.num_instructions] = inst;
		ags.backdoor_instructions[ags.num_instructions] = instruction;
		ags.num_instructions++;
		ags.current_phase = inst.phase;
	}
}